

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_search.c
# Opt level: O1

ps_lattice_t * ngram_search_lattice(ps_search_t *search)

{
  float fVar1;
  int iVar2;
  int iVar3;
  dictword_t *pdVar4;
  bool bVar5;
  int iVar6;
  int32 iVar7;
  uint uVar8;
  long lVar9;
  ps_lattice_t *ppVar10;
  ps_latnode_t *ppVar11;
  int32 *piVar12;
  ps_latnode_s *ppVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  bptbl_t *be;
  char *pcVar17;
  char *pcVar18;
  int iVar19;
  uint uVar20;
  ulong uVar21;
  int *piVar22;
  int iVar23;
  ulong uVar24;
  float32 lwf;
  int32 lscr;
  int32 ascr;
  ulong local_40;
  int32 local_34;
  
  lVar9 = ps_config_int(search->config,"min_endfr");
  if (*(int *)&search[3].last_link < -0x1fffffff) {
    return (ps_lattice_t *)0x0;
  }
  ppVar10 = search->dag;
  if ((ppVar10 != (ps_lattice_t *)0x0) && (ppVar10->n_frames == *(int *)((long)&search[3].type + 4))
     ) {
    return ppVar10;
  }
  ps_lattice_free(ppVar10);
  search->dag = (ps_lattice_t *)0x0;
  ppVar10 = ps_lattice_init_search(search,*(int *)((long)&search[3].type + 4));
  if (*(char *)((long)&search[1].name + 1) == '\0') {
    lwf = 1.0;
  }
  else {
    lwf = *(float32 *)((long)&search[3].dag + 4);
  }
  if (0 < search[2].start_wid) {
    piVar22 = *(int **)&search[2].post;
    iVar19 = 0;
    do {
      if ((char)piVar22[1] != '\0') {
        if ((long)piVar22[3] < 0) {
          iVar23 = 0;
        }
        else {
          iVar23 = *(int *)(*(long *)&search[2].post + (long)piVar22[3] * 0x24) + 1;
        }
        if (ppVar10->n_frames <= *piVar22) {
          __assert_fail("ef < dag->n_frames",
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search.c"
                        ,0x43c,"void create_dag_nodes(ngram_search_t *, ps_lattice_t *)");
        }
        iVar2 = piVar22[2];
        if (((iVar2 != search->finish_wid) || (ppVar10->n_frames + -1 <= *piVar22)) &&
           ((iVar6 = dict_filler_word(search->dict,iVar2), iVar6 != 0 ||
            (iVar7 = ngram_model_set_known_wid
                               ((ngram_model_t *)search[1].vt,search->dict->word[iVar2].basewid),
            iVar7 != 0)))) {
          for (ppVar11 = ppVar10->nodes; ppVar11 != (ps_latnode_t *)0x0; ppVar11 = ppVar11->next) {
            if ((ppVar11->wid == iVar2) && (ppVar11->sf == iVar23)) {
              ppVar11->lef = iVar19;
              goto LAB_00136cf9;
            }
          }
          ppVar11 = (ps_latnode_t *)
                    __listelem_malloc__(ppVar10->latnode_alloc,
                                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search.c"
                                        ,0x452);
          ppVar11->wid = iVar2;
          ppVar11->sf = iVar23;
          ppVar11->lef = iVar19;
          ppVar11->fef = iVar19;
          ppVar11->reachable = 0;
          ppVar11->exits = (latlink_list_t *)0x0;
          ppVar11->entries = (latlink_list_t *)0x0;
          ppVar11->next = ppVar10->nodes;
          ppVar10->nodes = ppVar11;
          ppVar10->n_nodes = ppVar10->n_nodes + 1;
        }
      }
LAB_00136cf9:
      iVar19 = iVar19 + 1;
      piVar22 = piVar22 + 9;
    } while (iVar19 < search[2].start_wid);
  }
  ppVar11 = ppVar10->nodes;
  if (ppVar11 != (ps_latnode_t *)0x0) {
    do {
      if ((ppVar11->wid == search->start_wid) && (ppVar11->sf == 0)) goto LAB_00136d59;
      ppVar11 = ppVar11->next;
    } while (ppVar11 != (ps_latnode_s *)0x0);
  }
  ppVar11 = (ps_latnode_t *)0x0;
  err_msg(ERR_ERROR,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search.c"
          ,0x470,"Couldn\'t find <s> in first frame\n");
LAB_00136d59:
  ppVar10->start = ppVar11;
  if (ppVar11 == (ps_latnode_t *)0x0) goto LAB_001373f8;
  fVar1 = (float)search[3].n_words;
  ppVar11 = ppVar10->nodes;
  if (ppVar11 != (ps_latnode_t *)0x0) {
    do {
      if ((ppVar11->wid == search->finish_wid) &&
         (*(int *)(*(long *)&search[2].post + (long)ppVar11->lef * 0x24) == ppVar10->n_frames + -1))
      goto LAB_00136fdc;
      ppVar11 = ppVar11->next;
    } while (ppVar11 != (ps_latnode_s *)0x0);
  }
  uVar8 = ppVar10->n_frames;
  uVar21 = (ulong)uVar8;
  uVar8 = (int)uVar8 >> 0x1f & uVar8;
  uVar14 = uVar21;
  do {
    uVar14 = uVar14 - 1;
    uVar20 = (uint)uVar21;
    if ((int)uVar20 < 1) {
      uVar21 = (ulong)(uVar8 - 1);
      uVar20 = uVar8;
      break;
    }
    uVar21 = (ulong)(uVar20 - 1);
  } while (*(int *)(search[3].name + (uVar14 & 0xffffffff) * 4) == search[2].start_wid);
  if ((int)uVar20 < 1) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search.c"
            ,0x48d,"Empty backpointer table: can not build DAG.\n");
LAB_00136fd7:
    ppVar11 = (ps_latnode_t *)0x0;
  }
  else {
    iVar19 = *(int *)(search[3].name + uVar21 * 4);
    uVar24 = (ulong)iVar19;
    uVar14 = (ulong)uVar20;
    uVar15 = 0xffffffff;
    iVar23 = -1;
    if (iVar19 < *(int *)(search[3].name + uVar14 * 4)) {
      lVar16 = uVar24 * 0x24;
      iVar19 = -0x20000000;
      local_40 = uVar14;
      do {
        iVar2 = *(int *)(*(long *)&search[2].post + 0x18 + lVar16);
        iVar6 = search->finish_wid;
        if (iVar2 == iVar6) {
          uVar15 = uVar24 & 0xffffffff;
        }
        else {
          iVar7 = ngram_tg_score((ngram_model_t *)search[1].vt,iVar6,iVar2,
                                 *(int32 *)(*(long *)&search[2].post + 0x1c + lVar16),&local_34);
          iVar23 = (int)((float)(iVar7 >> 10) * fVar1) +
                   *(int *)(*(long *)&search[2].post + 0x10 + lVar16);
          uVar14 = local_40;
          if (iVar19 < iVar23) {
            uVar15 = uVar24 & 0xffffffff;
            iVar19 = iVar23;
          }
        }
        iVar23 = (int)uVar15;
        if (iVar2 == iVar6) break;
        uVar24 = uVar24 + 1;
        lVar16 = lVar16 + 0x24;
      } while ((long)uVar24 < (long)*(int *)(search[3].name + uVar14 * 4));
    }
    if (iVar23 == -1) {
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search.c"
              ,0x4a6,"No word exits found in last frame (%d), assuming no recognition\n",uVar21);
      goto LAB_00136fd7;
    }
    pdVar4 = search->dict->word;
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search.c"
            ,0x4aa,"</s> not found in last frame, using %s.%d instead\n",
            pdVar4[pdVar4[*(int *)(*(long *)&search[2].post + 8 + (long)iVar23 * 0x24)].basewid].
            word,uVar21);
    for (ppVar11 = ppVar10->nodes; ppVar11 != (ps_latnode_t *)0x0; ppVar11 = ppVar11->next) {
      if (ppVar11->lef == iVar23) goto LAB_00136fdc;
    }
    pdVar4 = search->dict->word;
    ppVar11 = (ps_latnode_t *)0x0;
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search.c"
            ,0x4b4,"Failed to find DAG node corresponding to %s\n",
            pdVar4[pdVar4[*(int *)(*(long *)&search[2].post + 8 + (long)iVar23 * 0x24)].basewid].
            word);
  }
LAB_00136fdc:
  ppVar10->end = ppVar11;
  if (ppVar11 != (ps_latnode_t *)0x0) {
    lVar16 = (long)ppVar10->start->wid;
    if (lVar16 < 0) {
      pcVar17 = (char *)0x0;
    }
    else {
      pcVar17 = search->dict->word[lVar16].word;
    }
    uVar8 = 0;
    if ((long)ppVar11->wid < 0) {
      pcVar18 = (char *)0x0;
    }
    else {
      pcVar18 = search->dict->word[ppVar11->wid].word;
    }
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search.c"
            ,0x4df,"lattice start node %s.%d end node %s.%d\n",pcVar17,
            (ulong)(uint)ppVar10->start->sf,pcVar18,(ulong)(uint)ppVar11->sf);
    ngram_compute_seg_score
              ((ngram_search_t *)search,
               (bptbl_t *)((long)ppVar10->end->lef * 0x24 + *(long *)&search[2].post),lwf,
               &ppVar10->final_node_ascr,&lscr);
    if (ppVar10->nodes != (ps_latnode_t *)0x0) {
      uVar8 = 0;
      ppVar11 = ppVar10->nodes;
      do {
        if (ppVar11 == ppVar10->end) break;
        ppVar13 = ppVar11->next;
        __listelem_free__(ppVar10->latnode_alloc,ppVar11,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search.c"
                          ,0x4f5);
        ppVar10->nodes = ppVar13;
        uVar8 = uVar8 + 1;
        ppVar11 = ppVar13;
      } while (ppVar13 != (ps_latnode_s *)0x0);
    }
    uVar20 = 0;
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search.c"
            ,0x4f9,"Eliminated %d nodes before end node\n",(ulong)uVar8);
    ppVar11 = ppVar10->end;
    ppVar11->reachable = 1;
    if (ppVar11 != (ps_latnode_t *)0x0) {
      uVar20 = 0;
      do {
        if (ppVar11->reachable != 0) {
          if ((ppVar11 == ppVar10->end) ||
             ((int)lVar9 <=
              *(int *)(*(long *)&search[2].post + (long)ppVar11->lef * 0x24) -
              *(int *)(*(long *)&search[2].post + (long)ppVar11->fef * 0x24))) {
            for (ppVar13 = ppVar11->next; ppVar13 != (ps_latnode_t *)0x0; ppVar13 = ppVar13->next) {
              lVar16 = *(long *)&search[2].post;
              iVar19 = ppVar13->fef;
              uVar14 = (ulong)iVar19;
              iVar23 = *(int *)(lVar16 + uVar14 * 0x24);
              iVar2 = ppVar11->sf;
              if (iVar23 < iVar2) {
                iVar6 = ppVar13->lef;
                iVar3 = *(int *)(lVar16 + (long)iVar6 * 0x24);
                if (iVar2 <= iVar3 + 1) {
                  if (iVar3 - iVar23 < (int)lVar9) {
                    if (ppVar13->reachable != 0) {
                      __assert_fail("!from->reachable",
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search.c"
                                    ,0x516,"ps_lattice_t *ngram_search_lattice(ps_search_t *)");
                    }
                  }
                  else {
                    bVar5 = iVar6 < iVar19;
                    if (iVar19 <= iVar6) {
                      be = (bptbl_t *)(lVar16 + uVar14 * 0x24);
                      do {
                        if ((be->wid == ppVar13->wid) && (iVar2 + -1 <= be->frame)) {
                          if ((!bVar5) && (be->frame == iVar2 + -1)) {
                            ngram_compute_seg_score((ngram_search_t *)search,be,lwf,&ascr,&lscr);
                            if ((long)be->last2_phone == -1) {
                              piVar12 = &be->score;
                            }
                            else {
                              piVar12 = (int32 *)(((long)search->d2p->rssid[be->last_phone]
                                                         [be->last2_phone].cimap
                                                         [*search->dict->word[ppVar11->wid].ciphone]
                                                  + (long)be->s_idx) * 4 +
                                                 *(long *)&search[2].finish_wid);
                            }
                            if (*piVar12 != -0x20000000) {
                              iVar19 = *piVar12 - be->score;
                              iVar23 = iVar19 + ascr;
                              iVar7 = -0x67932;
                              if ((iVar23 != 0 && SCARRY4(iVar19,ascr) == iVar23 < 0) ||
                                 (iVar7 = iVar23, -0x20000000 < iVar23)) {
                                ps_lattice_link(ppVar10,ppVar13,ppVar11,iVar7,be->frame);
                                uVar20 = uVar20 + 1;
                                ppVar13->reachable = 1;
                              }
                            }
                          }
                          break;
                        }
                        be = be + 1;
                        uVar8 = (int)uVar14 + 1;
                        bVar5 = iVar6 <= (int)uVar14;
                        uVar14 = (ulong)uVar8;
                      } while (iVar6 + 1U != uVar8);
                    }
                  }
                }
              }
            }
          }
          else {
            ppVar11->reachable = 0;
          }
        }
        ppVar11 = ppVar11->next;
      } while (ppVar11 != (ps_latnode_s *)0x0);
    }
    if (ppVar10->start->reachable != 0) {
      ppVar11 = ppVar10->nodes;
      if (ppVar11 != (ps_latnode_t *)0x0) {
        lVar9 = *(long *)&search[2].post;
        pdVar4 = search->dict->word;
        do {
          ppVar11->fef = *(int32 *)(lVar9 + (long)ppVar11->fef * 0x24);
          ppVar11->lef = *(int32 *)(lVar9 + (long)ppVar11->lef * 0x24);
          ppVar11->basewid = pdVar4[ppVar11->wid].basewid;
          ppVar11 = ppVar11->next;
        } while (ppVar11 != (ps_latnode_s *)0x0);
      }
      ppVar11 = ppVar10->nodes;
      do {
        if (ppVar11 == (ps_latnode_t *)0x0) {
          err_msg(ERR_INFO,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search.c"
                  ,0x562,"Lattice has %d nodes, %d links\n",(ulong)(uint)ppVar10->n_nodes,
                  (ulong)uVar20);
          iVar19 = dict_filler_word(search->dict,ppVar10->end->wid);
          if (iVar19 != 0) {
            ppVar10->end->basewid = search->finish_wid;
          }
          ps_lattice_delete_unreachable(ppVar10);
          ps_lattice_penalize_fillers
                    (ppVar10,*(int32 *)&search[6].name,*(int32 *)((long)&search[6].type + 4));
          search->dag = ppVar10;
          return ppVar10;
        }
        ppVar13 = ppVar11->next;
        if (ppVar13 != (ps_latnode_s *)0x0) {
          do {
            if (ppVar13->sf != ppVar11->sf) break;
            if (ppVar13->basewid == ppVar11->basewid) {
              ppVar13->alt = ppVar11->alt;
              ppVar11->alt = ppVar13;
              break;
            }
            ppVar13 = ppVar13->next;
          } while (ppVar13 != (ps_latnode_s *)0x0);
        }
        ppVar11 = ppVar11->next;
      } while( true );
    }
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search.c"
            ,0x54a,"End node of lattice isolated; unreachable\n");
  }
LAB_001373f8:
  ps_lattice_free(ppVar10);
  return (ps_lattice_t *)0x0;
}

Assistant:

ps_lattice_t *
ngram_search_lattice(ps_search_t *search)
{
    int32 i, score, ascr, lscr;
    ps_latnode_t *node, *from, *to;
    ngram_search_t *ngs;
    ps_lattice_t *dag;
    int min_endfr, nlink;
    float lwf;

    ngs = (ngram_search_t *)search;
    min_endfr = ps_config_int(ps_search_config(search), "min_endfr");

    /* If the best score is WORST_SCORE or worse, there is no way to
     * make a lattice. */
    if (ngs->best_score == WORST_SCORE || ngs->best_score WORSE_THAN WORST_SCORE)
        return NULL;

    /* Check to see if a lattice has previously been created over the
     * same number of frames, and reuse it if so. */
    if (search->dag && search->dag->n_frames == ngs->n_frame)
        return search->dag;

    /* Nope, create a new one. */
    ps_lattice_free(search->dag);
    search->dag = NULL;
    dag = ps_lattice_init_search(search, ngs->n_frame);
    /* Compute these such that they agree with the fwdtree language weight. */
    lwf = ngs->fwdflat ? ngs->fwdflat_fwdtree_lw_ratio : 1.0;
    create_dag_nodes(ngs, dag);
    if ((dag->start = find_start_node(ngs, dag)) == NULL)
        goto error_out;
    if ((dag->end = find_end_node(ngs, dag, ngs->bestpath_fwdtree_lw_ratio)) == NULL)
        goto error_out;
    E_INFO("lattice start node %s.%d end node %s.%d\n",
           dict_wordstr(search->dict, dag->start->wid), dag->start->sf,
           dict_wordstr(search->dict, dag->end->wid), dag->end->sf);

    ngram_compute_seg_score(ngs, ngs->bp_table + dag->end->lef, lwf,
                            &dag->final_node_ascr, &lscr);

    /*
     * At this point, dag->nodes is ordered such that nodes earlier in
     * the list can follow (in time) those later in the list, but not
     * vice versa (see above - also note that adjacency is purely
     * determined by time which is why we can make this claim).  Now
     * create precedence links and simultanesously mark all nodes that
     * can reach dag->end.  (All nodes are reached from dag->start
     * simply by definition - they were created that way).
     *
     * Note that this also means that any nodes before dag->end in the
     * list can be discarded, meaning that dag->end will always be
     * equal to dag->nodes (FIXME: except when loading from a file but
     * we can fix that...)
     */
    i = 0;
    while (dag->nodes && dag->nodes != dag->end) {
        ps_latnode_t *next = dag->nodes->next;
        listelem_free(dag->latnode_alloc, dag->nodes);
        dag->nodes = next;
        ++i;
    }
    E_INFO("Eliminated %d nodes before end node\n", i);
    dag->end->reachable = TRUE;
    nlink = 0;
    for (to = dag->end; to; to = to->next) {
        int fef, lef;

        /* Skip if not reachable; it will never be reachable from dag->end */
        if (!to->reachable)
            continue;

        /* Prune nodes with too few endpoints - heuristic
           borrowed from Sphinx3 */
        fef = ngs->bp_table[to->fef].frame;
        lef = ngs->bp_table[to->lef].frame;
        if (to != dag->end && lef - fef < min_endfr) {
            to->reachable = FALSE;
            continue;
        }

        /* Find predecessors of to : from->fef+1 <= to->sf <= from->lef+1 */
        for (from = to->next; from; from = from->next) {
            bptbl_t *from_bpe;

            fef = ngs->bp_table[from->fef].frame;
            lef = ngs->bp_table[from->lef].frame;

            if ((to->sf <= fef) || (to->sf > lef + 1))
                continue;
            if (lef - fef < min_endfr) {
                assert(!from->reachable);
                continue;
            }

            /* Find bptable entry for "from" that exactly precedes "to" */
            i = from->fef;
            from_bpe = ngs->bp_table + i;
            for (; i <= from->lef; i++, from_bpe++) {
                if (from_bpe->wid != from->wid)
                    continue;
                if (from_bpe->frame >= to->sf - 1)
                    break;
            }

            if ((i > from->lef) || (from_bpe->frame != to->sf - 1))
                continue;

            /* Find acoustic score from.sf->to.sf-1 with right context = to */
            /* This gives us from_bpe's best acoustic score. */
            ngram_compute_seg_score(ngs, from_bpe, lwf,
                                    &ascr, &lscr);
            /* Now find the exact path score for from->to, including
             * the appropriate final triphone.  In fact this might not
             * exist. */
            score = ngram_search_exit_score(ngs, from_bpe,
                                            dict_first_phone(ps_search_dict(ngs), to->wid));
            /* Does not exist.  Can't create a link here. */
            if (score == WORST_SCORE)
                continue;
            /* Adjust the arc score to match the correct triphone. */
            else
                score = ascr + (score - from_bpe->score);
            if (score BETTER_THAN 0) {
                /* Scores must be negative, or Bad Things will happen.
                   In general, they are, except in corner cases
                   involving filler words.  We don't want to throw any
                   links away so we'll keep these, but with some
                   arbitrarily improbable but recognizable score. */
                ps_lattice_link(dag, from, to, -424242, from_bpe->frame);
                ++nlink;
                from->reachable = TRUE;
            }
            else if (score BETTER_THAN WORST_SCORE) {
                ps_lattice_link(dag, from, to, score, from_bpe->frame);
                ++nlink;
                from->reachable = TRUE;
            }
        }
    }

    /* There must be at least one path between dag->start and dag->end */
    if (!dag->start->reachable) {
        E_ERROR("End node of lattice isolated; unreachable\n");
        goto error_out;
    }

    for (node = dag->nodes; node; node = node->next) {
        /* Change node->{fef,lef} from bptbl indices to frames. */
        node->fef = ngs->bp_table[node->fef].frame;
        node->lef = ngs->bp_table[node->lef].frame;
        /* Find base wid for nodes. */
        node->basewid = dict_basewid(search->dict, node->wid);
    }

    /* Link nodes with alternate pronunciations at the same timepoint. */
    for (node = dag->nodes; node; node = node->next) {
        ps_latnode_t *alt;
        /* Scan forward to find the next alternate, then stop. */
        for (alt = node->next; alt && alt->sf == node->sf; alt = alt->next) {
            if (alt->basewid == node->basewid) {
                alt->alt = node->alt;
                node->alt = alt;
                break;
            }
        }
    }
    E_INFO("Lattice has %d nodes, %d links\n", dag->n_nodes, nlink);

    /* Minor hack: If the final node is a filler word and not </s>,
     * then set its base word ID to </s>, so that the language model
     * scores won't be screwed up. */
    if (dict_filler_word(ps_search_dict(ngs), dag->end->wid))
        dag->end->basewid = ps_search_finish_wid(ngs);

    /* Free nodes unreachable from dag->end and their links */
    ps_lattice_delete_unreachable(dag);

    /* Add silprob and fillprob to corresponding links */
    ps_lattice_penalize_fillers(dag, ngs->silpen, ngs->fillpen);

    search->dag = dag;
    return dag;

error_out:
    ps_lattice_free(dag);
    return NULL;
}